

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

void __thiscall QHexView::calcColumns(QHexView *this)

{
  QList<QRectF> *this_00;
  qreal qVar1;
  uint i;
  uint uVar2;
  uint j;
  uint uVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar4;
  undefined1 local_78 [16];
  QRectF local_68;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  if (this->m_hexdocument != (QHexDocument *)0x0) {
    this_00 = &this->m_hexcolumns;
    QList<QRectF>::clear(this_00);
    QList<QRectF>::reserve(this_00,(ulong)(this->m_options).linelength);
    qVar1 = hexColumnX(this);
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_8_ = qVar1;
    local_78._12_4_ = extraout_XMM0_Dd;
    qVar1 = cellWidth(this);
    local_38._8_4_ = extraout_XMM0_Dc_00;
    local_38._0_8_ = qVar1 + qVar1;
    local_38._12_4_ = extraout_XMM0_Dd_00;
    local_48._8_4_ = SUB84((double)(int)(double)CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00),0)
    ;
    local_48._0_8_ = (double)(int)(qVar1 + qVar1);
    local_48._12_4_ =
         (int)((ulong)(double)(int)(double)CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00) >> 0x20
              );
    for (uVar2 = 0; uVar2 < (this->m_options).linelength; uVar2 = uVar2 + 1) {
      for (uVar3 = 0; uVar3 < (this->m_options).grouplength; uVar3 = uVar3 + 1) {
        local_68.xp = (qreal)(int)(double)local_78._0_8_;
        local_68.yp = 0.0;
        local_68.w = (qreal)local_48._0_8_;
        local_68.h = 0.0;
        QList<QRectF>::emplaceBack<QRectF>(this_00,&local_68);
        uVar4 = local_78._12_4_;
        local_78._8_4_ = local_78._8_4_;
        local_78._0_8_ = (double)local_78._0_8_ + (double)local_38._0_8_;
        local_78._12_4_ = uVar4;
      }
      qVar1 = cellWidth(this);
      local_78._0_8_ = (double)local_78._0_8_ + qVar1;
    }
  }
  return;
}

Assistant:

void QHexView::calcColumns() {
    if(!m_hexdocument)
        return;

    m_hexcolumns.clear();
    m_hexcolumns.reserve(m_options.linelength);

    auto x = this->hexColumnX(), cw = this->cellWidth() * 2;

    for(auto i = 0u; i < m_options.linelength; i++) {
        for(auto j = 0u; j < m_options.grouplength; j++, x += cw)
            m_hexcolumns.push_back(QRect(x, 0, cw, 0));

        x += this->cellWidth();
    }
}